

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O3

string * tonk::GetConnectionLogPrefix(string *__return_storage_ptr__,string *hostname,uint16_t port)

{
  ostream *poVar1;
  string *psVar2;
  ostringstream oss;
  ostringstream aoStack_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_198,"[",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)aoStack_198,(hostname->_M_dataplus)._M_p,hostname->_M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] ",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  psVar2 = (string *)std::ios_base::~ios_base(local_128);
  return psVar2;
}

Assistant:

static std::string GetConnectionLogPrefix(const std::string& hostname, uint16_t port)
{
    std::ostringstream oss;
    oss << "[" << hostname << ":" << port << "] ";
    return oss.str();
}